

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall
amrex::StateData::getData
          (StateData *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *data,
          Vector<double,_std::allocator<double>_> *datatime,Real time)

{
  pointer *pppMVar1;
  TimeInterval *__args;
  double dVar2;
  double dVar3;
  pointer ppMVar4;
  pointer pdVar5;
  iterator iVar6;
  TimeCenter TVar7;
  TimeInterval *__args_00;
  iterator iVar8;
  double dVar9;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_38;
  double local_30;
  
  ppMVar4 = (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar4) {
    (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar4;
  }
  pdVar5 = (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((datatime->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar5) {
    (datatime->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar5;
  }
  local_30 = time;
  TVar7 = StateDescriptor::timeType(this->desc);
  if (TVar7 == Point) {
    local_38._M_head_impl =
         (this->old_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (local_38._M_head_impl == (MultiFab *)0x0) {
      local_38._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      iVar6._M_current =
           (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                   &local_38._M_head_impl);
      }
      else {
        *iVar6._M_current = local_38._M_head_impl;
        pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      iVar8._M_current =
           (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      __args_00 = &this->new_time;
      if (iVar8._M_current ==
          (datatime->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_00500489;
      local_30 = (this->new_time).start;
    }
    else {
      __args_00 = &this->new_time;
      dVar2 = (this->new_time).start;
      dVar3 = (this->old_time).start;
      dVar9 = (dVar2 - dVar3) * 0.001;
      if ((local_30 <= dVar2 - dVar9) || (dVar2 + dVar9 <= local_30)) {
        __args = &this->old_time;
        if ((dVar3 - dVar9 < local_30) && (local_30 < dVar3 + dVar9)) {
          iVar6._M_current =
               (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
            _M_realloc_insert<amrex::MultiFab*>
                      ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                       &local_38._M_head_impl);
          }
          else {
            *iVar6._M_current = local_38._M_head_impl;
            pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppMVar1 = *pppMVar1 + 1;
          }
          iVar8._M_current =
               (datatime->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          __args_00 = __args;
          if (iVar8._M_current ==
              (datatime->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) goto LAB_00500489;
          local_30 = __args->start;
          goto LAB_00500475;
        }
        iVar6._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          _M_realloc_insert<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                     &local_38._M_head_impl);
        }
        else {
          *iVar6._M_current = local_38._M_head_impl;
          pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        local_38._M_head_impl =
             (this->new_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        iVar6._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          _M_realloc_insert<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                     &local_38._M_head_impl);
        }
        else {
          *iVar6._M_current = local_38._M_head_impl;
          pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        iVar8._M_current =
             (datatime->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar8._M_current ==
            (datatime->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)datatime,iVar8,&__args->start);
        }
        else {
          *iVar8._M_current = __args->start;
          (datatime->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar8._M_current + 1;
        }
      }
      else {
        local_38._M_head_impl =
             (this->new_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        iVar6._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          _M_realloc_insert<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                     &local_38._M_head_impl);
        }
        else {
          *iVar6._M_current = local_38._M_head_impl;
          pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
      }
      iVar8._M_current =
           (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar8._M_current ==
          (datatime->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
LAB_00500489:
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)datatime,iVar8,&__args_00->start);
        return;
      }
      local_30 = __args_00->start;
    }
  }
  else {
    dVar2 = (this->new_time).start;
    dVar3 = (this->old_time).start;
    dVar9 = (dVar2 - dVar3) * 0.001;
    if ((local_30 <= dVar2 - dVar9) || ((this->new_time).stop + dVar9 <= local_30)) {
      local_38._M_head_impl =
           (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if ((local_30 <= dVar3 - dVar9 || local_38._M_head_impl == (MultiFab *)0x0) ||
         (dVar9 + (this->old_time).stop <= local_30)) {
        Error_host("StateData::getData(): how did we get here?");
        return;
      }
    }
    else {
      local_38._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    }
    iVar6._M_current =
         (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      _M_realloc_insert<amrex::MultiFab*>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar6,
                 &local_38._M_head_impl);
    }
    else {
      *iVar6._M_current = local_38._M_head_impl;
      pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
    iVar8._M_current =
         (datatime->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar8._M_current ==
        (datatime->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      __args_00 = (TimeInterval *)&local_30;
      goto LAB_00500489;
    }
  }
LAB_00500475:
  *iVar8._M_current = local_30;
  (datatime->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       iVar8._M_current + 1;
  return;
}

Assistant:

void
StateData::getData (Vector<MultiFab*>& data,
                    Vector<Real>& datatime,
                    Real time) const
{
    data.clear();
    datatime.clear();

    if (desc->timeType() == StateDescriptor::Point)
    {
        BL_ASSERT(new_data != nullptr);
        if (old_data == nullptr)
        {
            data.push_back(new_data.get());
            datatime.push_back(new_time.start);
        }
        else
        {
            const Real teps = (new_time.start - old_time.start)*1.e-3_rt;
            if (time > new_time.start-teps && time < new_time.start+teps) {
                data.push_back(new_data.get());
                datatime.push_back(new_time.start);
            } else if (time > old_time.start-teps && time < old_time.start+teps) {
                data.push_back(old_data.get());
                datatime.push_back(old_time.start);
            } else {
                data.push_back(old_data.get());
                data.push_back(new_data.get());
                datatime.push_back(old_time.start);
                datatime.push_back(new_time.start);
            }
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            data.push_back(new_data.get());
            datatime.push_back(time);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            data.push_back(old_data.get());
            datatime.push_back(time);
        }
        else
        {
            amrex::Error("StateData::getData(): how did we get here?");
        }
    }
}